

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GeneratePolicyHeaderCode(cmExportFileGenerator *this,ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Generated by CMake\n\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.8)\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"   message(FATAL_ERROR \"CMake >= 2.8.0 required\")\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"if(CMAKE_VERSION VERSION_LESS \"2.8.3\")\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"   message(FATAL_ERROR \"CMake >= 2.8.3 required\")\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(os,"cmake_policy(PUSH)\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(os,"cmake_policy(VERSION 2.8.3...3.24)\n",0x23)
  ;
  return;
}

Assistant:

void cmExportFileGenerator::GeneratePolicyHeaderCode(std::ostream& os)
{
  // Protect that file against use with older CMake versions.
  /* clang-format off */
  os << "# Generated by CMake\n\n";
  os << "if(\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" LESS 2.8)\n"
     << "   message(FATAL_ERROR \"CMake >= 2.8.0 required\")\n"
     << "endif()\n"
     << "if(CMAKE_VERSION VERSION_LESS \"2.8.3\")\n"
     << "   message(FATAL_ERROR \"CMake >= 2.8.3 required\")\n"
     << "endif()\n";
  /* clang-format on */

  // Isolate the file policy level.
  // Support CMake versions as far back as 2.6 but also support using NEW
  // policy settings for up to CMake 3.24 (this upper limit may be reviewed
  // and increased from time to time). This reduces the opportunity for CMake
  // warnings when an older export file is later used with newer CMake
  // versions.
  /* clang-format off */
  os << "cmake_policy(PUSH)\n"
     << "cmake_policy(VERSION 2.8.3...3.24)\n";
  /* clang-format on */
}